

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [24];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [24];
  long *in_RSI;
  double dVar30;
  float fVar31;
  float fVar32;
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_1790;
  undefined8 uStack_1788;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  int local_16f8;
  undefined8 local_16e8;
  undefined8 local_16e0;
  undefined8 local_16d8;
  undefined4 local_16d0;
  long local_16c8;
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined8 local_16a8;
  undefined1 (*local_16a0) [32];
  int local_1694;
  int local_1690;
  int local_168c;
  int local_1688;
  int local_1684;
  int local_1680;
  int local_167c;
  long *local_1670;
  undefined1 local_165d;
  int local_165c;
  undefined8 *local_1650;
  undefined8 *local_1648;
  undefined8 *local_1638;
  undefined4 local_1624;
  undefined1 local_1620 [32];
  undefined1 (*local_15e8) [32];
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  undefined1 local_1520 [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [8];
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  ulong uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 (*local_1348) [32];
  undefined4 local_1340;
  undefined4 uStack_133c;
  undefined4 uStack_1338;
  undefined4 uStack_1334;
  undefined4 local_1324;
  undefined1 local_1320 [16];
  undefined1 (*local_1308) [32];
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [16];
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [16];
  undefined1 local_1270 [8];
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  ulong uStack_11b8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined1 (*local_1198) [32];
  long local_1190;
  undefined4 local_1184;
  long local_1180;
  undefined1 (*local_1178) [32];
  undefined4 local_116c;
  int local_1168;
  int local_1164;
  undefined8 *local_1160;
  undefined4 local_1154;
  long local_1150;
  undefined8 *local_1130;
  undefined1 local_1100 [16];
  undefined1 auStack_10f0 [16];
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined4 local_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  float fStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  undefined4 uStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined4 local_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined4 local_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_167c = *(int *)((long)in_RSI + 0x2c);
  local_1680 = (int)in_RSI[6];
  local_1684 = *(int *)((long)in_RSI + 0x34);
  local_1688 = (int)in_RSI[7];
  local_168c = (int)in_RSI[3];
  local_1690 = local_167c * local_1680 * local_1684 * local_168c;
  local_1670 = in_RSI;
  for (local_1694 = 0; local_1694 < local_1688; local_1694 = local_1694 + 1) {
    local_1650 = &local_16e8;
    local_1164 = *(int *)((long)local_1670 + 0x2c);
    local_1168 = (int)local_1670[6];
    local_116c = *(undefined4 *)((long)local_1670 + 0x34);
    local_1178 = (undefined1 (*) [32])
                 (*local_1670 + local_1670[8] * (long)local_1694 * local_1670[2]);
    local_1180 = local_1670[2];
    local_1184 = (undefined4)local_1670[3];
    local_1190 = local_1670[4];
    local_1160 = &local_16e8;
    local_1150 = (long)local_1164 * (long)local_1168 * local_1180;
    local_1648 = &local_16e8;
    local_1638 = &local_16e8;
    local_1154 = 0x10;
    local_165c = local_1694;
    local_165d = 1;
    local_16e8 = 0;
    local_16d8 = 0;
    local_16d0 = 0;
    local_16c0 = 0;
    local_16bc = 0;
    local_16b8 = 0;
    local_16b4 = 0;
    local_16b0 = 0;
    local_16a8 = 0;
    local_16e0 = 0;
    local_16f8 = 0;
    local_1624 = 0x3f800000;
    local_10c4 = 0x3f800000;
    local_10c8 = 0x3f800000;
    local_10cc = 0x3f800000;
    local_10d0 = 0x3f800000;
    local_10d4 = 0x3f800000;
    local_10d8 = 0x3f800000;
    local_10dc = 0x3f800000;
    local_10e0 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_1100 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_10f0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1620._8_8_ = SUB328(ZEXT832(0),4);
    local_16a0 = local_1178;
    for (; local_16f8 + 7 < local_1690; local_16f8 = local_16f8 + 8) {
      local_15e8 = local_16a0;
      auVar11 = *(undefined1 (*) [24])*local_16a0;
      uStack_15a8 = *(undefined8 *)(*local_16a0 + 0x18);
      local_1760 = auVar11._0_8_;
      local_15c0 = local_1760;
      uStack_1758 = auVar11._8_8_;
      uStack_15b8 = uStack_1758;
      uStack_1750 = auVar11._16_8_;
      uStack_15b0 = uStack_1750;
      local_13a0 = 0;
      uStack_1398 = local_1620._8_8_;
      uStack_1390 = 0;
      uStack_1388 = 0;
      auVar6 = vsubps_avx(ZEXT832((ulong)local_1620._8_8_) << 0x40,*local_16a0);
      local_1460 = ZEXT832(0) << 0x20;
      local_1500 = 0x3f8000003f800000;
      uStack_14f8 = 0x3f8000003f800000;
      uStack_14f0 = 0x3f8000003f800000;
      uStack_14e8 = 0x3f8000003f800000;
      local_1480._0_8_ = auVar6._0_8_;
      local_10a0 = local_1480._0_8_;
      local_1480._8_8_ = auVar6._8_8_;
      uStack_1098 = local_1480._8_8_;
      local_1480._16_8_ = auVar6._16_8_;
      uStack_1090 = local_1480._16_8_;
      local_1480._24_8_ = auVar6._24_8_;
      uStack_1088 = local_1480._24_8_;
      local_10c0 = 0x42b0c0a542b0c0a5;
      uStack_10b8 = 0x42b0c0a542b0c0a5;
      uStack_10b0 = 0x42b0c0a542b0c0a5;
      uStack_10a8 = 0x42b0c0a542b0c0a5;
      auVar5._8_8_ = 0x42b0c0a542b0c0a5;
      auVar5._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5._16_8_ = 0x42b0c0a542b0c0a5;
      auVar5._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar5);
      local_1480._0_8_ = auVar6._0_8_;
      local_1060 = local_1480._0_8_;
      local_1480._8_8_ = auVar6._8_8_;
      uStack_1058 = local_1480._8_8_;
      local_1480._16_8_ = auVar6._16_8_;
      uStack_1050 = local_1480._16_8_;
      local_1480._24_8_ = auVar6._24_8_;
      uStack_1048 = local_1480._24_8_;
      local_1080 = 0xc2b0c0a5c2b0c0a5;
      uStack_1078 = 0xc2b0c0a5c2b0c0a5;
      uStack_1070 = 0xc2b0c0a5c2b0c0a5;
      uStack_1068 = 0xc2b0c0a5c2b0c0a5;
      auVar13._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar6,auVar13);
      local_1480._0_8_ = auVar4._0_8_;
      local_c40 = local_1480._0_8_;
      local_1480._8_8_ = auVar4._8_8_;
      uStack_c38 = local_1480._8_8_;
      local_1480._16_8_ = auVar4._16_8_;
      uStack_c30 = local_1480._16_8_;
      local_1480._24_8_ = auVar4._24_8_;
      uStack_c28 = local_1480._24_8_;
      local_c60 = 0x3fb8aa3b3fb8aa3b;
      uStack_c58 = 0x3fb8aa3b3fb8aa3b;
      uStack_c50 = 0x3fb8aa3b3fb8aa3b;
      uStack_c48 = 0x3fb8aa3b3fb8aa3b;
      local_fa0 = 0x3f0000003f000000;
      uStack_f98 = 0x3f0000003f000000;
      uStack_f90 = 0x3f0000003f000000;
      uStack_f88 = 0x3f0000003f000000;
      uVar7 = local_1480._0_8_;
      uVar8 = local_1480._8_8_;
      uVar9 = local_1480._16_8_;
      uVar10 = local_1480._24_8_;
      local_9e0 = 0x3fb8aa3b3fb8aa3b;
      uStack_9d8 = 0x3fb8aa3b3fb8aa3b;
      uStack_9d0 = 0x3fb8aa3b3fb8aa3b;
      uStack_9c8 = 0x3fb8aa3b3fb8aa3b;
      local_9c0._0_4_ = auVar4._0_4_;
      local_9c0._4_4_ = auVar4._4_4_;
      uStack_9b8._0_4_ = auVar4._8_4_;
      uStack_9b8._4_4_ = auVar4._12_4_;
      uStack_9b0._0_4_ = auVar4._16_4_;
      uStack_9b0._4_4_ = auVar4._20_4_;
      uStack_9a8._0_4_ = auVar4._24_4_;
      uStack_be4 = 0x3fb8aa3b;
      local_c00 = (float)local_9c0 * 1.442695;
      fStack_bfc = local_9c0._4_4_ * 1.442695;
      fStack_bf8 = (float)uStack_9b8 * 1.442695;
      fStack_bf4 = uStack_9b8._4_4_ * 1.442695;
      fStack_bf0 = (float)uStack_9b0 * 1.442695;
      fStack_bec = uStack_9b0._4_4_ * 1.442695;
      fStack_be8 = (float)uStack_9a8 * 1.442695;
      local_c20 = 0x3f0000003f000000;
      uStack_c18 = 0x3f0000003f000000;
      uStack_c10 = 0x3f0000003f000000;
      uStack_c08 = 0x3f0000003f000000;
      local_14c0._4_4_ = fStack_bfc + 0.5;
      local_14c0._0_4_ = local_c00 + 0.5;
      uStack_14b8._0_4_ = fStack_bf8 + 0.5;
      uStack_14b8._4_4_ = fStack_bf4 + 0.5;
      uStack_14b0._0_4_ = fStack_bf0 + 0.5;
      uStack_14b0._4_4_ = fStack_bec + 0.5;
      uStack_14a8._0_4_ = fStack_be8 + 0.5;
      uStack_14a8._4_4_ = 0x3ff8aa3b;
      auVar5 = vroundps_avx(_local_14c0,1);
      auVar6 = vcmpps_avx(_local_14c0,auVar5,1);
      local_1520._0_8_ = auVar6._0_8_;
      local_bc0 = local_1520._0_8_;
      local_1520._8_8_ = auVar6._8_8_;
      uStack_bb8 = local_1520._8_8_;
      local_1520._16_8_ = auVar6._16_8_;
      uStack_bb0 = local_1520._16_8_;
      local_1520._24_8_ = auVar6._24_8_;
      uStack_ba8 = local_1520._24_8_;
      local_be0 = 0x3f8000003f800000;
      uStack_bd8 = 0x3f8000003f800000;
      uStack_bd0 = 0x3f8000003f800000;
      uStack_bc8 = 0x3f8000003f800000;
      auVar14._8_8_ = 0x3f8000003f800000;
      auVar14._0_8_ = 0x3f8000003f800000;
      auVar14._16_8_ = 0x3f8000003f800000;
      auVar14._24_8_ = 0x3f8000003f800000;
      local_1520 = vandps_avx(auVar6,auVar14);
      local_14a0 = auVar5._0_8_;
      local_13e0 = local_14a0;
      uStack_1498 = auVar5._8_8_;
      uStack_13d8 = uStack_1498;
      uStack_1490 = auVar5._16_8_;
      uStack_13d0 = uStack_1490;
      uStack_1488 = auVar5._24_8_;
      uStack_13c8 = uStack_1488;
      local_1400 = local_1520._0_8_;
      uStack_13f8 = local_1520._8_8_;
      uStack_13f0 = local_1520._16_8_;
      uStack_13e8 = local_1520._24_8_;
      _local_14c0 = vsubps_avx(auVar5,local_1520);
      local_ac0 = local_14c0;
      uStack_ab8 = uStack_14b8;
      uStack_ab0 = uStack_14b0;
      uStack_aa8 = uStack_14a8;
      local_b00 = local_1480._0_8_;
      uStack_af8 = local_1480._8_8_;
      uStack_af0 = local_1480._16_8_;
      uStack_ae8 = local_1480._24_8_;
      local_ae0 = 0x3f3180003f318000;
      uStack_ad8 = 0x3f3180003f318000;
      uStack_ad0 = 0x3f3180003f318000;
      uStack_ac8 = 0x3f3180003f318000;
      local_a80 = local_1480._0_8_;
      uStack_a78 = local_1480._8_8_;
      uStack_a70 = local_1480._16_8_;
      uStack_a68 = local_1480._24_8_;
      local_a60 = 0x3f3180003f318000;
      uStack_a58 = 0x3f3180003f318000;
      uStack_a50 = 0x3f3180003f318000;
      uStack_a48 = 0x3f3180003f318000;
      local_a40._0_4_ = local_14c0._0_4_;
      local_a40._4_4_ = local_14c0._4_4_;
      uStack_a38._0_4_ = local_14c0._8_4_;
      uStack_a38._4_4_ = local_14c0._12_4_;
      uStack_a30._0_4_ = local_14c0._16_4_;
      uStack_a30._4_4_ = local_14c0._20_4_;
      uStack_a28._0_4_ = local_14c0._24_4_;
      uStack_a28._4_4_ = local_14c0._28_4_;
      fStack_a84 = uStack_a28._4_4_;
      local_aa0 = (float)local_a40 * 0.6933594;
      fStack_a9c = local_a40._4_4_ * 0.6933594;
      fStack_a98 = (float)uStack_a38 * 0.6933594;
      fStack_a94 = uStack_a38._4_4_ * 0.6933594;
      fStack_a90 = (float)uStack_a30 * 0.6933594;
      fStack_a8c = uStack_a30._4_4_ * 0.6933594;
      fStack_a88 = (float)uStack_a28 * 0.6933594;
      auVar16._4_4_ = fStack_a9c;
      auVar16._0_4_ = local_aa0;
      auVar16._8_4_ = fStack_a98;
      auVar16._12_4_ = fStack_a94;
      auVar16._16_4_ = fStack_a90;
      auVar16._20_4_ = fStack_a8c;
      auVar16._24_4_ = fStack_a88;
      auVar16._28_4_ = uStack_a28._4_4_;
      auVar6 = vsubps_avx(auVar4,auVar16);
      local_b60 = local_14c0;
      uStack_b58 = uStack_14b8;
      uStack_b50 = uStack_14b0;
      uStack_b48 = uStack_14a8;
      local_1480._0_8_ = auVar6._0_8_;
      local_ba0 = local_1480._0_8_;
      local_1480._8_8_ = auVar6._8_8_;
      uStack_b98 = local_1480._8_8_;
      local_1480._16_8_ = auVar6._16_8_;
      uStack_b90 = local_1480._16_8_;
      local_1480._24_8_ = auVar6._24_8_;
      uStack_b88 = local_1480._24_8_;
      local_b80 = 0xb95e8083b95e8083;
      uStack_b78 = 0xb95e8083b95e8083;
      uStack_b70 = 0xb95e8083b95e8083;
      uStack_b68 = 0xb95e8083b95e8083;
      local_b20 = local_1480._0_8_;
      uStack_b18 = local_1480._8_8_;
      uStack_b10 = local_1480._16_8_;
      uStack_b08 = local_1480._24_8_;
      local_a00 = local_14c0;
      uStack_9f8 = uStack_14b8;
      uStack_9f0 = uStack_14b0;
      uStack_9e8 = uStack_14a8;
      local_a20 = 0xb95e8083b95e8083;
      uStack_a18 = 0xb95e8083b95e8083;
      uStack_a10 = 0xb95e8083b95e8083;
      uStack_a08 = 0xb95e8083b95e8083;
      fStack_b24 = uStack_a28._4_4_;
      local_b40 = (float)local_a40 * -0.00021219444;
      fStack_b3c = local_a40._4_4_ * -0.00021219444;
      fStack_b38 = (float)uStack_a38 * -0.00021219444;
      fStack_b34 = uStack_a38._4_4_ * -0.00021219444;
      fStack_b30 = (float)uStack_a30 * -0.00021219444;
      fStack_b2c = uStack_a30._4_4_ * -0.00021219444;
      fStack_b28 = (float)uStack_a28 * -0.00021219444;
      auVar15._4_4_ = fStack_b3c;
      auVar15._0_4_ = local_b40;
      auVar15._8_4_ = fStack_b38;
      auVar15._12_4_ = fStack_b34;
      auVar15._16_4_ = fStack_b30;
      auVar15._20_4_ = fStack_b2c;
      auVar15._24_4_ = fStack_b28;
      auVar15._28_4_ = uStack_a28._4_4_;
      local_1480 = vsubps_avx(auVar6,auVar15);
      local_7e0 = local_1480._0_8_;
      uStack_7d8 = local_1480._8_8_;
      uStack_7d0 = local_1480._16_8_;
      uStack_7c8 = local_1480._24_8_;
      local_7c0._0_4_ = local_1480._0_4_;
      local_7c0._4_4_ = local_1480._4_4_;
      uStack_7b8._0_4_ = local_1480._8_4_;
      uStack_7b8._4_4_ = local_1480._12_4_;
      uStack_7b0._0_4_ = local_1480._16_4_;
      uStack_7b0._4_4_ = local_1480._20_4_;
      uStack_7a8._0_4_ = local_1480._24_4_;
      uStack_7a8._4_4_ = local_1480._28_4_;
      local_14a0 = CONCAT44(local_7c0._4_4_ * local_7c0._4_4_,(float)local_7c0 * (float)local_7c0);
      uStack_1498._0_4_ = (float)uStack_7b8 * (float)uStack_7b8;
      uStack_1498._4_4_ = uStack_7b8._4_4_ * uStack_7b8._4_4_;
      uStack_1490._0_4_ = (float)uStack_7b0 * (float)uStack_7b0;
      uStack_1490._4_4_ = uStack_7b0._4_4_ * uStack_7b0._4_4_;
      auVar29 = _local_14a0;
      uStack_1488._0_4_ = (float)uStack_7a8 * (float)uStack_7a8;
      uStack_1488._4_4_ = uStack_7a8._4_4_;
      auVar5 = _local_14a0;
      local_ce0 = 0x3950696739506967;
      uStack_cd8 = 0x3950696739506967;
      uStack_cd0 = 0x3950696739506967;
      uStack_cc8 = 0x3950696739506967;
      local_d00 = local_1480._0_8_;
      uStack_cf8 = local_1480._8_8_;
      uStack_cf0 = local_1480._16_8_;
      uStack_ce8 = local_1480._24_8_;
      local_d20 = 0x3ab743ce3ab743ce;
      uStack_d18 = 0x3ab743ce3ab743ce;
      uStack_d10 = 0x3ab743ce3ab743ce;
      uStack_d08 = 0x3ab743ce3ab743ce;
      local_9a0 = local_1480._0_8_;
      uStack_998 = local_1480._8_8_;
      uStack_990 = local_1480._16_8_;
      uStack_988 = local_1480._24_8_;
      fStack_c84 = uStack_7a8._4_4_;
      local_ca0 = (float)local_7c0 * 0.00019875691;
      fStack_c9c = local_7c0._4_4_ * 0.00019875691;
      fStack_c98 = (float)uStack_7b8 * 0.00019875691;
      fStack_c94 = uStack_7b8._4_4_ * 0.00019875691;
      fStack_c90 = (float)uStack_7b0 * 0.00019875691;
      fStack_c8c = uStack_7b0._4_4_ * 0.00019875691;
      fStack_c88 = (float)uStack_7a8 * 0.00019875691;
      local_cc0 = 0x3ab743ce3ab743ce;
      uStack_cb8 = 0x3ab743ce3ab743ce;
      uStack_cb0 = 0x3ab743ce3ab743ce;
      uStack_ca8 = 0x3ab743ce3ab743ce;
      local_d80 = CONCAT44(fStack_c9c + 0.0013981999,local_ca0 + 0.0013981999);
      uStack_d78 = CONCAT44(fStack_c94 + 0.0013981999,fStack_c98 + 0.0013981999);
      uStack_d70 = CONCAT44(fStack_c8c + 0.0013981999,fStack_c90 + 0.0013981999);
      uStack_d68 = CONCAT44(uStack_7a8._4_4_ + 0.0013981999,fStack_c88 + 0.0013981999);
      local_da0 = local_1480._0_8_;
      uStack_d98 = local_1480._8_8_;
      uStack_d90 = local_1480._16_8_;
      uStack_d88 = local_1480._24_8_;
      local_dc0 = 0x3c0889083c088908;
      uStack_db8 = 0x3c0889083c088908;
      uStack_db0 = 0x3c0889083c088908;
      uStack_da8 = 0x3c0889083c088908;
      local_960 = local_1480._0_8_;
      uStack_958 = local_1480._8_8_;
      uStack_950 = local_1480._16_8_;
      uStack_948 = local_1480._24_8_;
      fStack_d24 = uStack_7a8._4_4_;
      local_d40 = (local_ca0 + 0.0013981999) * (float)local_7c0;
      fStack_d3c = (fStack_c9c + 0.0013981999) * local_7c0._4_4_;
      fStack_d38 = (fStack_c98 + 0.0013981999) * (float)uStack_7b8;
      fStack_d34 = (fStack_c94 + 0.0013981999) * uStack_7b8._4_4_;
      fStack_d30 = (fStack_c90 + 0.0013981999) * (float)uStack_7b0;
      fStack_d2c = (fStack_c8c + 0.0013981999) * uStack_7b0._4_4_;
      fStack_d28 = (fStack_c88 + 0.0013981999) * (float)uStack_7a8;
      local_d60 = 0x3c0889083c088908;
      uStack_d58 = 0x3c0889083c088908;
      uStack_d50 = 0x3c0889083c088908;
      uStack_d48 = 0x3c0889083c088908;
      local_e20 = CONCAT44(fStack_d3c + 0.008333452,local_d40 + 0.008333452);
      uStack_e18 = CONCAT44(fStack_d34 + 0.008333452,fStack_d38 + 0.008333452);
      uStack_e10 = CONCAT44(fStack_d2c + 0.008333452,fStack_d30 + 0.008333452);
      uStack_e08 = CONCAT44(uStack_7a8._4_4_ + 0.008333452,fStack_d28 + 0.008333452);
      local_e40 = local_1480._0_8_;
      uStack_e38 = local_1480._8_8_;
      uStack_e30 = local_1480._16_8_;
      uStack_e28 = local_1480._24_8_;
      local_e60 = 0x3d2aa9c13d2aa9c1;
      uStack_e58 = 0x3d2aa9c13d2aa9c1;
      uStack_e50 = 0x3d2aa9c13d2aa9c1;
      uStack_e48 = 0x3d2aa9c13d2aa9c1;
      local_920 = local_1480._0_8_;
      uStack_918 = local_1480._8_8_;
      uStack_910 = local_1480._16_8_;
      uStack_908 = local_1480._24_8_;
      fStack_dc4 = uStack_7a8._4_4_;
      local_de0 = (local_d40 + 0.008333452) * (float)local_7c0;
      fStack_ddc = (fStack_d3c + 0.008333452) * local_7c0._4_4_;
      fStack_dd8 = (fStack_d38 + 0.008333452) * (float)uStack_7b8;
      fStack_dd4 = (fStack_d34 + 0.008333452) * uStack_7b8._4_4_;
      fStack_dd0 = (fStack_d30 + 0.008333452) * (float)uStack_7b0;
      fStack_dcc = (fStack_d2c + 0.008333452) * uStack_7b0._4_4_;
      fStack_dc8 = (fStack_d28 + 0.008333452) * (float)uStack_7a8;
      local_e00 = 0x3d2aa9c13d2aa9c1;
      uStack_df8 = 0x3d2aa9c13d2aa9c1;
      uStack_df0 = 0x3d2aa9c13d2aa9c1;
      uStack_de8 = 0x3d2aa9c13d2aa9c1;
      local_ec0 = CONCAT44(fStack_ddc + 0.041665796,local_de0 + 0.041665796);
      uStack_eb8 = CONCAT44(fStack_dd4 + 0.041665796,fStack_dd8 + 0.041665796);
      uStack_eb0 = CONCAT44(fStack_dcc + 0.041665796,fStack_dd0 + 0.041665796);
      uStack_ea8 = CONCAT44(uStack_7a8._4_4_ + 0.041665796,fStack_dc8 + 0.041665796);
      local_ee0 = local_1480._0_8_;
      uStack_ed8 = local_1480._8_8_;
      uStack_ed0 = local_1480._16_8_;
      uStack_ec8 = local_1480._24_8_;
      local_f00 = 0x3e2aaaaa3e2aaaaa;
      uStack_ef8 = 0x3e2aaaaa3e2aaaaa;
      uStack_ef0 = 0x3e2aaaaa3e2aaaaa;
      uStack_ee8 = 0x3e2aaaaa3e2aaaaa;
      local_8e0 = local_1480._0_8_;
      uStack_8d8 = local_1480._8_8_;
      uStack_8d0 = local_1480._16_8_;
      uStack_8c8 = local_1480._24_8_;
      fStack_e64 = uStack_7a8._4_4_;
      local_e80 = (local_de0 + 0.041665796) * (float)local_7c0;
      fStack_e7c = (fStack_ddc + 0.041665796) * local_7c0._4_4_;
      fStack_e78 = (fStack_dd8 + 0.041665796) * (float)uStack_7b8;
      fStack_e74 = (fStack_dd4 + 0.041665796) * uStack_7b8._4_4_;
      fStack_e70 = (fStack_dd0 + 0.041665796) * (float)uStack_7b0;
      fStack_e6c = (fStack_dcc + 0.041665796) * uStack_7b0._4_4_;
      fStack_e68 = (fStack_dc8 + 0.041665796) * (float)uStack_7a8;
      local_ea0 = 0x3e2aaaaa3e2aaaaa;
      uStack_e98 = 0x3e2aaaaa3e2aaaaa;
      uStack_e90 = 0x3e2aaaaa3e2aaaaa;
      uStack_e88 = 0x3e2aaaaa3e2aaaaa;
      local_f60 = CONCAT44(fStack_e7c + 0.16666666,local_e80 + 0.16666666);
      uStack_f58 = CONCAT44(fStack_e74 + 0.16666666,fStack_e78 + 0.16666666);
      uStack_f50 = CONCAT44(fStack_e6c + 0.16666666,fStack_e70 + 0.16666666);
      uStack_f48 = CONCAT44(uStack_7a8._4_4_ + 0.16666666,fStack_e68 + 0.16666666);
      local_f80 = local_1480._0_8_;
      uStack_f78 = local_1480._8_8_;
      uStack_f70 = local_1480._16_8_;
      uStack_f68 = local_1480._24_8_;
      local_8a0 = local_1480._0_8_;
      uStack_898 = local_1480._8_8_;
      uStack_890 = local_1480._16_8_;
      uStack_888 = local_1480._24_8_;
      fStack_f04 = uStack_7a8._4_4_;
      local_f20 = (local_e80 + 0.16666666) * (float)local_7c0;
      fStack_f1c = (fStack_e7c + 0.16666666) * local_7c0._4_4_;
      fStack_f18 = (fStack_e78 + 0.16666666) * (float)uStack_7b8;
      fStack_f14 = (fStack_e74 + 0.16666666) * uStack_7b8._4_4_;
      fStack_f10 = (fStack_e70 + 0.16666666) * (float)uStack_7b0;
      fStack_f0c = (fStack_e6c + 0.16666666) * uStack_7b0._4_4_;
      fStack_f08 = (fStack_e68 + 0.16666666) * (float)uStack_7a8;
      local_f40 = 0x3f0000003f000000;
      uStack_f38 = 0x3f0000003f000000;
      uStack_f30 = 0x3f0000003f000000;
      uStack_f28 = 0x3f0000003f000000;
      local_840 = CONCAT44(fStack_f1c + 0.5,local_f20 + 0.5);
      auVar2._8_4_ = fStack_f18 + 0.5;
      auVar2._0_8_ = local_840;
      auVar2._12_4_ = fStack_f14 + 0.5;
      auVar11._16_4_ = fStack_f10 + 0.5;
      auVar11._0_16_ = auVar2;
      auVar11._20_4_ = fStack_f0c + 0.5;
      auVar4._24_4_ = fStack_f08 + 0.5;
      auVar4._0_24_ = auVar11;
      auVar4._28_4_ = uStack_7a8._4_4_ + 0.5;
      local_1020 = local_14a0;
      uStack_1018 = uStack_1498;
      uStack_1490 = auVar29._16_8_;
      uStack_1010 = uStack_1490;
      uStack_1488 = auVar5._24_8_;
      uStack_1008 = uStack_1488;
      local_1040 = local_1480._0_8_;
      uStack_1038 = local_1480._8_8_;
      uStack_1030 = local_1480._16_8_;
      uStack_1028 = local_1480._24_8_;
      local_1000._8_8_ = auVar2._8_8_;
      uStack_838 = local_1000._8_8_;
      local_1000._16_8_ = auVar11._16_8_;
      uStack_830 = local_1000._16_8_;
      local_1000._24_8_ = auVar4._24_8_;
      uStack_828 = local_1000._24_8_;
      local_860 = local_14a0;
      uStack_858 = uStack_1498;
      uStack_850 = uStack_1490;
      uStack_848 = uStack_1488;
      fStack_fa4 = uStack_7a8._4_4_;
      local_fc0 = (local_f20 + 0.5) * (float)local_7c0 * (float)local_7c0;
      fStack_fbc = (fStack_f1c + 0.5) * local_7c0._4_4_ * local_7c0._4_4_;
      fStack_fb8 = (fStack_f18 + 0.5) * (float)uStack_7b8 * (float)uStack_7b8;
      fStack_fb4 = (fStack_f14 + 0.5) * uStack_7b8._4_4_ * uStack_7b8._4_4_;
      fStack_fb0 = (fStack_f10 + 0.5) * (float)uStack_7b0 * (float)uStack_7b0;
      fStack_fac = (fStack_f0c + 0.5) * uStack_7b0._4_4_ * uStack_7b0._4_4_;
      fStack_fa8 = (fStack_f08 + 0.5) * (float)uStack_7a8 * (float)uStack_7a8;
      local_fe0 = local_1480._0_8_;
      uStack_fd8 = local_1480._8_8_;
      uStack_fd0 = local_1480._16_8_;
      uStack_fc8 = local_1480._24_8_;
      local_1420 = CONCAT44(fStack_fbc + local_7c0._4_4_,local_fc0 + (float)local_7c0);
      uStack_1418 = CONCAT44(fStack_fb4 + uStack_7b8._4_4_,fStack_fb8 + (float)uStack_7b8);
      uStack_1410 = CONCAT44(fStack_fac + uStack_7b0._4_4_,fStack_fb0 + (float)uStack_7b0);
      uStack_1408 = CONCAT44(uStack_7a8._4_4_ + uStack_7a8._4_4_,fStack_fa8 + (float)uStack_7a8);
      local_1440 = 0x3f8000003f800000;
      uStack_1438 = 0x3f8000003f800000;
      uStack_1430 = 0x3f8000003f800000;
      uStack_1428 = 0x3f8000003f800000;
      local_1540 = local_fc0 + (float)local_7c0 + 1.0;
      fStack_153c = fStack_fbc + local_7c0._4_4_ + 1.0;
      fStack_1538 = fStack_fb8 + (float)uStack_7b8 + 1.0;
      fStack_1534 = fStack_fb4 + uStack_7b8._4_4_ + 1.0;
      fStack_1530 = fStack_fb0 + (float)uStack_7b0 + 1.0;
      fStack_152c = fStack_fac + uStack_7b0._4_4_ + 1.0;
      fStack_1528 = fStack_fa8 + (float)uStack_7a8 + 1.0;
      fStack_1524 = uStack_7a8._4_4_ + uStack_7a8._4_4_ + 1.0;
      local_7a0 = local_14c0;
      uStack_798 = uStack_14b8;
      uStack_790 = uStack_14b0;
      uStack_788 = uStack_14a8;
      local_14e0 = CONCAT44((int)local_a40._4_4_,(int)(float)local_a40);
      uStack_14d8 = CONCAT44((int)uStack_a38._4_4_,(int)(float)uStack_a38);
      uStack_14d0 = CONCAT44((int)uStack_a30._4_4_,(int)(float)uStack_a30);
      uStack_14c8 = CONCAT44((int)uStack_a28._4_4_,(int)(float)uStack_a28);
      local_6a0 = local_14e0;
      uStack_698 = uStack_14d8;
      uStack_690 = uStack_14d0;
      uStack_688 = uStack_14c8;
      local_6c0 = 0x7f0000007f;
      uStack_6b8 = 0x7f0000007f;
      uStack_6b0 = 0x7f0000007f;
      uStack_6a8 = 0x7f0000007f;
      local_740 = local_14e0;
      uStack_738 = uStack_14d8;
      uStack_730 = uStack_14d0;
      uStack_728 = uStack_14c8;
      local_760 = 0x7f0000007f;
      uStack_758 = 0x7f0000007f;
      uStack_750 = 0x7f0000007f;
      uStack_748 = 0x7f0000007f;
      local_6f0 = 0x7f0000007f;
      uStack_6e8 = 0x7f0000007f;
      local_700 = 0x7f0000007f;
      uStack_6f8 = 0x7f0000007f;
      local_560 = local_14e0;
      uStack_558 = uStack_14d8;
      local_570 = 0x7f0000007f;
      uStack_568 = 0x7f0000007f;
      auVar18._8_8_ = uStack_14d8;
      auVar18._0_8_ = local_14e0;
      auVar17._8_8_ = 0x7f0000007f;
      auVar17._0_8_ = 0x7f0000007f;
      local_6d0 = vpaddd_avx(auVar18,auVar17);
      local_580 = uStack_14d0;
      uStack_578 = uStack_14c8;
      local_590 = 0x7f0000007f;
      uStack_588 = 0x7f0000007f;
      auVar3._8_8_ = uStack_14c8;
      auVar3._0_8_ = uStack_14d0;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_6e0 = vpaddd_avx(auVar3,auVar1);
      local_780 = local_6d0._0_8_;
      uStack_778 = local_6d0._8_8_;
      uStack_770 = local_6e0._0_8_;
      uStack_768 = local_6e0._8_8_;
      local_720 = local_6d0._0_8_;
      uStack_718 = local_6d0._8_8_;
      uStack_710 = local_6e0._0_8_;
      uStack_708 = local_6e0._8_8_;
      local_5e0 = local_6d0._0_8_;
      uStack_5d8 = local_6d0._8_8_;
      uStack_5d0 = local_6e0._0_8_;
      uStack_5c8 = local_6e0._8_8_;
      local_5e4 = 0x17;
      local_660 = local_6d0._0_8_;
      uStack_658 = local_6d0._8_8_;
      uStack_650 = local_6e0._0_8_;
      uStack_648 = local_6e0._8_8_;
      local_500 = local_6d0._0_8_;
      uStack_4f8 = local_6d0._8_8_;
      local_504 = 0x17;
      local_600 = vpslld_avx(local_6d0,ZEXT416(0x17));
      local_520 = local_6e0._0_8_;
      uStack_518 = local_6e0._8_8_;
      local_524 = 0x17;
      local_610 = vpslld_avx(local_6e0,ZEXT416(0x17));
      local_680 = local_600._0_8_;
      uStack_678 = local_600._8_8_;
      uStack_670 = local_610._0_8_;
      uStack_668 = local_610._8_8_;
      local_640 = local_600._0_8_;
      uStack_638 = local_600._8_8_;
      uStack_630 = local_610._0_8_;
      uStack_628 = local_610._8_8_;
      local_14e0 = local_600._0_8_;
      uStack_14d8 = local_600._8_8_;
      uStack_14d0 = local_610._0_8_;
      uStack_14c8 = local_610._8_8_;
      local_5c0 = local_600._0_8_;
      uStack_5b8 = local_600._8_8_;
      uStack_5b0 = local_610._0_8_;
      uStack_5a8 = local_610._8_8_;
      local_1560 = local_600._0_8_;
      uStack_1558 = local_600._8_8_;
      uStack_1550 = local_610._0_8_;
      uStack_1548 = local_610._8_8_;
      local_800._4_4_ = fStack_153c;
      local_800._0_4_ = local_1540;
      local_800._8_4_ = fStack_1538;
      local_800._12_4_ = fStack_1534;
      local_800._16_4_ = fStack_1530;
      local_800._20_4_ = fStack_152c;
      local_800._24_4_ = fStack_1528;
      local_800._28_4_ = fStack_1524;
      local_820._0_4_ = local_600._0_4_;
      local_820._4_4_ = local_600._4_4_;
      uStack_818._0_4_ = local_600._8_4_;
      uStack_818._4_4_ = local_600._12_4_;
      uStack_810._0_4_ = local_610._0_4_;
      uStack_810._4_4_ = local_610._4_4_;
      uStack_808._0_4_ = local_610._8_4_;
      local_1540 = local_1540 * (float)local_820;
      fStack_153c = fStack_153c * local_820._4_4_;
      fStack_1538 = fStack_1538 * (float)uStack_818;
      fStack_1534 = fStack_1534 * uStack_818._4_4_;
      fStack_1530 = fStack_1530 * (float)uStack_810;
      fStack_152c = fStack_152c * uStack_810._4_4_;
      fStack_1528 = fStack_1528 * (float)uStack_808;
      local_15a0 = CONCAT44(fStack_153c,local_1540);
      uStack_1598 = CONCAT44(fStack_1534,fStack_1538);
      uStack_1590 = CONCAT44(fStack_152c,fStack_1530);
      uStack_1588 = CONCAT44(fStack_1524,fStack_1528);
      local_1580._0_4_ = local_1100._0_4_;
      local_1580._4_4_ = local_1100._4_4_;
      uStack_1578._0_4_ = local_1100._8_4_;
      uStack_1578._4_4_ = local_1100._12_4_;
      uStack_1570._0_4_ = auStack_10f0._0_4_;
      uStack_1570._4_4_ = auStack_10f0._4_4_;
      uStack_1568._0_4_ = auStack_10f0._8_4_;
      uStack_1568._4_4_ = auStack_10f0._12_4_;
      local_15e0 = (float)local_1580 + local_1540;
      fStack_15dc = local_1580._4_4_ + fStack_153c;
      fStack_15d8 = (float)uStack_1578 + fStack_1538;
      fStack_15d4 = uStack_1578._4_4_ + fStack_1534;
      fStack_15d0 = (float)uStack_1570 + fStack_1530;
      fStack_15cc = uStack_1570._4_4_ + fStack_152c;
      fStack_15c8 = (float)uStack_1568 + fStack_1528;
      fStack_15c4 = uStack_1568._4_4_ + fStack_1524;
      auVar6._4_4_ = fStack_15dc;
      auVar6._0_4_ = local_15e0;
      auVar6._8_4_ = fStack_15d8;
      auVar6._12_4_ = fStack_15d4;
      auVar6._16_4_ = fStack_15d0;
      auVar6._20_4_ = fStack_15cc;
      auVar6._24_4_ = fStack_15c8;
      auVar6._28_4_ = fStack_15c4;
      auVar6 = vdivps_avx(*local_16a0,auVar6);
      local_1348 = local_16a0;
      local_1760 = auVar6._0_8_;
      local_1380 = local_1760;
      uStack_1758 = auVar6._8_8_;
      uStack_1378 = uStack_1758;
      uStack_1750 = auVar6._16_8_;
      uStack_1370 = uStack_1750;
      uStack_1748 = auVar6._24_8_;
      uStack_1368 = uStack_1748;
      *(undefined8 *)*local_16a0 = local_1760;
      *(undefined8 *)(*local_16a0 + 8) = uStack_1758;
      *(undefined8 *)(*local_16a0 + 0x10) = uStack_1750;
      *(undefined8 *)(*local_16a0 + 0x18) = uStack_1748;
      local_16a0 = local_16a0 + 1;
      local_1580 = local_1100._0_8_;
      uStack_1578 = local_1100._8_8_;
      uStack_1570 = auStack_10f0._0_8_;
      uStack_1568 = auStack_10f0._8_8_;
      _local_14a0 = auVar5;
      local_13c0 = local_15c0;
      uStack_13b8 = uStack_15b8;
      uStack_13b0 = uStack_15b0;
      uStack_13a8 = uStack_15a8;
      local_1000 = auVar4;
      local_c80 = local_fa0;
      uStack_c78 = uStack_f98;
      uStack_c70 = uStack_f90;
      uStack_c68 = uStack_f88;
      local_a40 = local_14c0;
      uStack_a38 = uStack_14b8;
      uStack_a30 = uStack_14b0;
      uStack_a28 = uStack_14a8;
      local_9c0 = uVar7;
      uStack_9b8 = uVar8;
      uStack_9b0 = uVar9;
      uStack_9a8 = uVar10;
      local_980 = local_ce0;
      uStack_978 = uStack_cd8;
      uStack_970 = uStack_cd0;
      uStack_968 = uStack_cc8;
      local_940 = local_d80;
      uStack_938 = uStack_d78;
      uStack_930 = uStack_d70;
      uStack_928 = uStack_d68;
      local_900 = local_e20;
      uStack_8f8 = uStack_e18;
      uStack_8f0 = uStack_e10;
      uStack_8e8 = uStack_e08;
      local_8c0 = local_ec0;
      uStack_8b8 = uStack_eb8;
      uStack_8b0 = uStack_eb0;
      uStack_8a8 = uStack_ea8;
      local_880 = local_f60;
      uStack_878 = uStack_f58;
      uStack_870 = uStack_f50;
      uStack_868 = uStack_f48;
      local_820 = local_600._0_8_;
      uStack_818 = local_600._8_8_;
      uStack_810 = local_610._0_8_;
      uStack_808 = local_610._8_8_;
      local_7c0 = local_7e0;
      uStack_7b8 = uStack_7d8;
      uStack_7b0 = uStack_7d0;
      uStack_7a8 = uStack_7c8;
    }
    local_1324 = 0x3f800000;
    local_1340 = 0x3f800000;
    uStack_133c = 0x3f800000;
    uStack_1338 = 0x3f800000;
    uStack_1334 = 0x3f800000;
    local_1320._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_1620 = ZEXT832(0) << 0x20, auVar2 = ZEXT816(0) << 0x20, local_1130 = local_1638,
        local_16c8 = local_1190, local_16f8 + 3 < local_1690; local_16f8 = local_16f8 + 4) {
      local_1308 = local_16a0;
      local_12f0 = *(undefined8 *)*local_16a0;
      uStack_12e8 = *(undefined8 *)(*local_16a0 + 8);
      local_11c0 = 0;
      uStack_11b8 = local_1320._8_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_1320._8_8_;
      auVar2 = vsubps_avx(auVar28 << 0x40,*(undefined1 (*) [16])*local_16a0);
      local_1240 = ZEXT816(0) << 0x20;
      local_1290 = 0x3f8000003f800000;
      uStack_1288 = 0x3f8000003f800000;
      local_1250._0_8_ = auVar2._0_8_;
      local_4c0 = local_1250._0_8_;
      local_1250._8_8_ = auVar2._8_8_;
      uStack_4b8 = local_1250._8_8_;
      local_4d0 = 0x42b0c0a542b0c0a5;
      uStack_4c8 = 0x42b0c0a542b0c0a5;
      auVar21._8_8_ = 0x42b0c0a542b0c0a5;
      auVar21._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar21);
      local_1250._0_8_ = auVar2._0_8_;
      local_4a0 = local_1250._0_8_;
      local_1250._8_8_ = auVar2._8_8_;
      uStack_498 = local_1250._8_8_;
      local_4b0 = 0xc2b0c0a5c2b0c0a5;
      uStack_4a8 = 0xc2b0c0a5c2b0c0a5;
      auVar22._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar22);
      local_1250._0_8_ = auVar3._0_8_;
      uVar7 = local_1250._0_8_;
      local_1250._8_8_ = auVar3._8_8_;
      uVar8 = local_1250._8_8_;
      local_450 = 0x3fb8aa3b3fb8aa3b;
      uStack_448 = 0x3fb8aa3b3fb8aa3b;
      local_440._0_4_ = auVar3._0_4_;
      local_440._4_4_ = auVar3._4_4_;
      uStack_438._0_4_ = auVar3._8_4_;
      uStack_438._4_4_ = auVar3._12_4_;
      local_1270._4_4_ = local_440._4_4_ * 1.442695;
      local_1270._0_4_ = (float)local_440 * 1.442695;
      uStack_1268._0_4_ = (float)uStack_438 * 1.442695;
      uStack_1268._4_4_ = uStack_438._4_4_ * 1.442695;
      local_1200 = local_1270;
      uStack_11f8 = uStack_1268;
      local_1210 = 0x3f0000003f000000;
      uStack_1208 = 0x3f0000003f000000;
      local_1270._0_4_ = (float)local_440 * 1.442695 + 0.5;
      local_1270._4_4_ = local_440._4_4_ * 1.442695 + 0.5;
      fVar31 = (float)uStack_438 * 1.442695 + 0.5;
      fVar32 = uStack_438._4_4_ * 1.442695 + 0.5;
      uStack_1268._0_4_ = fVar31;
      uStack_1268._4_4_ = fVar32;
      local_420 = local_1270;
      uStack_418 = uStack_1268;
      local_1280._4_4_ = (int)(float)local_1270._4_4_;
      local_1280._0_4_ = (int)(float)local_1270._0_4_;
      local_1280._8_4_ = (int)fVar31;
      local_1280._12_4_ = (int)fVar32;
      local_410 = local_1280._0_8_;
      uStack_408 = local_1280._8_8_;
      auVar23._8_8_ = local_1280._8_8_;
      auVar23._0_8_ = local_1280._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar23);
      local_1260 = auVar1._0_8_;
      local_3f0 = local_1260;
      uStack_1258 = auVar1._8_8_;
      uStack_3e8 = uStack_1258;
      local_400 = local_1270;
      uStack_3f8 = uStack_1268;
      auVar24._8_8_ = uStack_1268;
      auVar24._0_8_ = local_1270;
      auVar2 = vcmpps_avx(auVar24,auVar1,1);
      local_12a0._0_8_ = auVar2._0_8_;
      local_3d0 = local_12a0._0_8_;
      local_12a0._8_8_ = auVar2._8_8_;
      uStack_3c8 = local_12a0._8_8_;
      local_3e0 = 0x3f8000003f800000;
      uStack_3d8 = 0x3f8000003f800000;
      auVar25._8_8_ = 0x3f8000003f800000;
      auVar25._0_8_ = 0x3f8000003f800000;
      local_12a0 = vpand_avx(auVar2,auVar25);
      local_11e0 = local_1260;
      uStack_11d8 = uStack_1258;
      local_11f0 = local_12a0._0_8_;
      uStack_11e8 = local_12a0._8_8_;
      _local_1270 = vsubps_avx(auVar1,local_12a0);
      local_330 = local_1270;
      uStack_328 = uStack_1268;
      local_350 = local_1250._0_8_;
      uStack_348 = local_1250._8_8_;
      local_340 = 0x3f3180003f318000;
      uStack_338 = 0x3f3180003f318000;
      local_310 = local_1250._0_8_;
      uStack_308 = local_1250._8_8_;
      local_300 = 0x3f3180003f318000;
      uStack_2f8 = 0x3f3180003f318000;
      local_2f0._0_4_ = local_1270._0_4_;
      local_2f0._4_4_ = local_1270._4_4_;
      uStack_2e8._0_4_ = local_1270._8_4_;
      uStack_2e8._4_4_ = local_1270._12_4_;
      local_320 = (float)local_2f0 * 0.6933594;
      fStack_31c = local_2f0._4_4_ * 0.6933594;
      fStack_318 = (float)uStack_2e8 * 0.6933594;
      fStack_314 = uStack_2e8._4_4_ * 0.6933594;
      auVar27._4_4_ = fStack_31c;
      auVar27._0_4_ = local_320;
      auVar27._8_4_ = fStack_318;
      auVar27._12_4_ = fStack_314;
      auVar2 = vsubps_avx(auVar3,auVar27);
      local_3a0 = local_1270;
      uStack_398 = uStack_1268;
      local_1250._0_8_ = auVar2._0_8_;
      local_3c0 = local_1250._0_8_;
      local_1250._8_8_ = auVar2._8_8_;
      uStack_3b8 = local_1250._8_8_;
      local_3b0 = 0xb95e8083b95e8083;
      uStack_3a8 = 0xb95e8083b95e8083;
      local_380 = local_1250._0_8_;
      uStack_378 = local_1250._8_8_;
      local_360 = local_1270;
      uStack_358 = uStack_1268;
      local_370 = 0xb95e8083b95e8083;
      uStack_368 = 0xb95e8083b95e8083;
      local_390 = (float)local_2f0 * -0.00021219444;
      fStack_38c = local_2f0._4_4_ * -0.00021219444;
      fStack_388 = (float)uStack_2e8 * -0.00021219444;
      fStack_384 = uStack_2e8._4_4_ * -0.00021219444;
      auVar26._4_4_ = fStack_38c;
      auVar26._0_4_ = local_390;
      auVar26._8_4_ = fStack_388;
      auVar26._12_4_ = fStack_384;
      local_1250 = vsubps_avx(auVar2,auVar26);
      local_470 = local_1250._0_8_;
      uStack_468 = local_1250._8_8_;
      local_460._0_4_ = local_1250._0_4_;
      local_460._4_4_ = local_1250._4_4_;
      uStack_458._0_4_ = local_1250._8_4_;
      uStack_458._4_4_ = local_1250._12_4_;
      local_1260 = CONCAT44(local_460._4_4_ * local_460._4_4_,(float)local_460 * (float)local_460);
      uStack_1258._0_4_ = (float)uStack_458 * (float)uStack_458;
      uStack_1258._4_4_ = uStack_458._4_4_ * uStack_458._4_4_;
      local_90 = 0x3950696739506967;
      uStack_88 = 0x3950696739506967;
      local_a0 = local_1250._0_8_;
      uStack_98 = local_1250._8_8_;
      local_b0 = 0x3ab743ce3ab743ce;
      uStack_a8 = 0x3ab743ce3ab743ce;
      local_60 = local_1250._0_8_;
      uStack_58 = local_1250._8_8_;
      local_70 = (float)local_460 * 0.00019875691;
      fStack_6c = local_460._4_4_ * 0.00019875691;
      fStack_68 = (float)uStack_458 * 0.00019875691;
      fStack_64 = uStack_458._4_4_ * 0.00019875691;
      local_80 = 0x3ab743ce3ab743ce;
      uStack_78 = 0x3ab743ce3ab743ce;
      local_100 = CONCAT44(fStack_6c + 0.0013981999,local_70 + 0.0013981999);
      uStack_f8 = CONCAT44(fStack_64 + 0.0013981999,fStack_68 + 0.0013981999);
      local_110 = local_1250._0_8_;
      uStack_108 = local_1250._8_8_;
      local_120 = 0x3c0889083c088908;
      uStack_118 = 0x3c0889083c088908;
      local_d0 = local_1250._0_8_;
      uStack_c8 = local_1250._8_8_;
      local_e0 = (local_70 + 0.0013981999) * (float)local_460;
      fStack_dc = (fStack_6c + 0.0013981999) * local_460._4_4_;
      fStack_d8 = (fStack_68 + 0.0013981999) * (float)uStack_458;
      fStack_d4 = (fStack_64 + 0.0013981999) * uStack_458._4_4_;
      local_f0 = 0x3c0889083c088908;
      uStack_e8 = 0x3c0889083c088908;
      local_170 = CONCAT44(fStack_dc + 0.008333452,local_e0 + 0.008333452);
      uStack_168 = CONCAT44(fStack_d4 + 0.008333452,fStack_d8 + 0.008333452);
      local_180 = local_1250._0_8_;
      uStack_178 = local_1250._8_8_;
      local_190 = 0x3d2aa9c13d2aa9c1;
      uStack_188 = 0x3d2aa9c13d2aa9c1;
      local_140 = local_1250._0_8_;
      uStack_138 = local_1250._8_8_;
      local_150 = (local_e0 + 0.008333452) * (float)local_460;
      fStack_14c = (fStack_dc + 0.008333452) * local_460._4_4_;
      fStack_148 = (fStack_d8 + 0.008333452) * (float)uStack_458;
      fStack_144 = (fStack_d4 + 0.008333452) * uStack_458._4_4_;
      local_160 = 0x3d2aa9c13d2aa9c1;
      uStack_158 = 0x3d2aa9c13d2aa9c1;
      local_1e0 = CONCAT44(fStack_14c + 0.041665796,local_150 + 0.041665796);
      uStack_1d8 = CONCAT44(fStack_144 + 0.041665796,fStack_148 + 0.041665796);
      local_1f0 = local_1250._0_8_;
      uStack_1e8 = local_1250._8_8_;
      local_200 = 0x3e2aaaaa3e2aaaaa;
      uStack_1f8 = 0x3e2aaaaa3e2aaaaa;
      local_1b0 = local_1250._0_8_;
      uStack_1a8 = local_1250._8_8_;
      local_1c0 = (local_150 + 0.041665796) * (float)local_460;
      fStack_1bc = (fStack_14c + 0.041665796) * local_460._4_4_;
      fStack_1b8 = (fStack_148 + 0.041665796) * (float)uStack_458;
      fStack_1b4 = (fStack_144 + 0.041665796) * uStack_458._4_4_;
      local_1d0 = 0x3e2aaaaa3e2aaaaa;
      uStack_1c8 = 0x3e2aaaaa3e2aaaaa;
      local_250 = CONCAT44(fStack_1bc + 0.16666666,local_1c0 + 0.16666666);
      uStack_248 = CONCAT44(fStack_1b4 + 0.16666666,fStack_1b8 + 0.16666666);
      local_260 = local_1250._0_8_;
      uStack_258 = local_1250._8_8_;
      local_220 = local_1250._0_8_;
      uStack_218 = local_1250._8_8_;
      local_230 = (local_1c0 + 0.16666666) * (float)local_460;
      fStack_22c = (fStack_1bc + 0.16666666) * local_460._4_4_;
      fStack_228 = (fStack_1b8 + 0.16666666) * (float)uStack_458;
      fStack_224 = (fStack_1b4 + 0.16666666) * uStack_458._4_4_;
      local_240 = 0x3f0000003f000000;
      uStack_238 = 0x3f0000003f000000;
      local_280 = CONCAT44(fStack_22c + 0.5,local_230 + 0.5);
      local_2c0._8_4_ = fStack_228 + 0.5;
      local_2c0._0_8_ = local_280;
      local_2c0._12_4_ = fStack_224 + 0.5;
      local_2d0 = local_1260;
      uStack_2c8 = uStack_1258;
      local_2e0 = local_1250._0_8_;
      uStack_2d8 = local_1250._8_8_;
      uStack_278 = local_2c0._8_8_;
      local_290 = local_1260;
      uStack_288 = uStack_1258;
      local_2a0 = (local_230 + 0.5) * (float)local_460 * (float)local_460;
      fStack_29c = (fStack_22c + 0.5) * local_460._4_4_ * local_460._4_4_;
      fStack_298 = (fStack_228 + 0.5) * (float)uStack_458 * (float)uStack_458;
      fStack_294 = (fStack_224 + 0.5) * uStack_458._4_4_ * uStack_458._4_4_;
      local_2b0 = local_1250._0_8_;
      uStack_2a8 = local_1250._8_8_;
      local_1220 = CONCAT44(fStack_29c + local_460._4_4_,local_2a0 + (float)local_460);
      uStack_1218 = CONCAT44(fStack_294 + uStack_458._4_4_,fStack_298 + (float)uStack_458);
      local_1230 = 0x3f8000003f800000;
      uStack_1228 = 0x3f8000003f800000;
      local_12b0 = local_2a0 + (float)local_460 + 1.0;
      fStack_12ac = fStack_29c + local_460._4_4_ + 1.0;
      fStack_12a8 = fStack_298 + (float)uStack_458 + 1.0;
      fStack_12a4 = fStack_294 + uStack_458._4_4_ + 1.0;
      local_430 = local_1270;
      uStack_428 = uStack_1268;
      local_1280._4_4_ = (int)local_2f0._4_4_;
      local_1280._0_4_ = (int)(float)local_2f0;
      local_1280._8_4_ = (int)(float)uStack_2e8;
      local_1280._12_4_ = (int)uStack_2e8._4_4_;
      local_540 = local_1280._0_8_;
      uStack_538 = local_1280._8_8_;
      local_550 = 0x7f0000007f;
      uStack_548 = 0x7f0000007f;
      auVar20._8_8_ = local_1280._8_8_;
      auVar20._0_8_ = local_1280._0_8_;
      auVar19._8_8_ = 0x7f0000007f;
      auVar19._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar20,auVar19);
      local_1280._0_8_ = auVar2._0_8_;
      local_4e0 = local_1280._0_8_;
      local_1280._8_8_ = auVar2._8_8_;
      uStack_4d8 = local_1280._8_8_;
      local_4e4 = 0x17;
      local_1280 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_40 = local_1280._0_8_;
      uStack_38 = local_1280._8_8_;
      local_12c0 = local_1280._0_8_;
      uStack_12b8 = local_1280._8_8_;
      local_480._4_4_ = fStack_12ac;
      local_480._0_4_ = local_12b0;
      local_480._8_4_ = fStack_12a8;
      local_480._12_4_ = fStack_12a4;
      local_490._0_4_ = local_1280._0_4_;
      local_490._4_4_ = local_1280._4_4_;
      uStack_488._0_4_ = local_1280._8_4_;
      uStack_488._4_4_ = local_1280._12_4_;
      local_12b0 = local_12b0 * (float)local_490;
      fStack_12ac = fStack_12ac * local_490._4_4_;
      fStack_12a8 = fStack_12a8 * (float)uStack_488;
      fStack_12a4 = fStack_12a4 * uStack_488._4_4_;
      local_12e0 = CONCAT44(fStack_12ac,local_12b0);
      uStack_12d8 = CONCAT44(fStack_12a4,fStack_12a8);
      local_1300 = local_12b0 + 1.0;
      fStack_12fc = fStack_12ac + 1.0;
      fStack_12f8 = fStack_12a8 + 1.0;
      fStack_12f4 = fStack_12a4 + 1.0;
      auVar12._4_4_ = fStack_12fc;
      auVar12._0_4_ = local_1300;
      auVar12._8_4_ = fStack_12f8;
      auVar12._12_4_ = fStack_12f4;
      auVar2 = vdivps_avx(*(undefined1 (*) [16])*local_16a0,auVar12);
      local_1198 = local_16a0;
      local_1790 = auVar2._0_8_;
      local_11b0 = local_1790;
      uStack_1788 = auVar2._8_8_;
      uStack_11a8 = uStack_1788;
      *(undefined8 *)*local_16a0 = local_1790;
      *(undefined8 *)(*local_16a0 + 8) = uStack_1788;
      local_16a0 = (undefined1 (*) [32])(*local_16a0 + 0x10);
      local_12d0 = 0x3f8000003f800000;
      uStack_12c8 = 0x3f8000003f800000;
      local_11d0 = local_12f0;
      uStack_11c8 = uStack_12e8;
      local_490 = local_1280._0_8_;
      uStack_488 = local_1280._8_8_;
      local_460 = local_470;
      uStack_458 = uStack_468;
      local_440 = uVar7;
      uStack_438 = uVar8;
      local_2f0 = local_1270;
      uStack_2e8 = uStack_1268;
      local_270 = local_1210;
      uStack_268 = uStack_1208;
      local_210 = local_250;
      uStack_208 = uStack_248;
      local_1a0 = local_1e0;
      uStack_198 = uStack_1d8;
      local_130 = local_170;
      uStack_128 = uStack_168;
      local_c0 = local_100;
      uStack_b8 = uStack_f8;
      local_50 = local_90;
      uStack_48 = uStack_88;
    }
    for (; local_1320 = auVar2, local_16f8 < local_1690; local_16f8 = local_16f8 + 1) {
      fVar31 = *(float *)*local_16a0;
      dVar30 = std::exp((double)(ulong)(*(uint *)*local_16a0 ^ 0x80000000));
      *(float *)*local_16a0 = fVar31 / (SUB84(dVar30,0) + 1.0);
      local_16a0 = (undefined1 (*) [32])(*local_16a0 + 4);
      auVar2 = local_1320;
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}